

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tape.cpp
# Opt level: O1

void writeheader(uchar flag,char *fname,unsigned_short param1,unsigned_short param2,
                unsigned_short param3,FILE *fp)

{
  byte bVar1;
  uchar uVar2;
  byte bVar3;
  int iVar4;
  undefined7 in_register_00000039;
  
  fputc(0x13,(FILE *)fp);
  parity = parity ^ 0x13;
  fputc(0,(FILE *)fp);
  fputc(0,(FILE *)fp);
  parity = '\0';
  fputc((int)CONCAT71(in_register_00000039,flag),(FILE *)fp);
  parity = parity ^ flag;
  iVar4 = 10;
  do {
    bVar1 = *fname;
    bVar3 = bVar1;
    if (bVar1 == 0) {
      bVar3 = 0x20;
    }
    fname = (char *)((byte *)fname + (bVar1 != 0));
    fputc((uint)bVar3,(FILE *)fp);
    parity = parity ^ bVar3;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  writeword((uint)param1,fp);
  writeword((uint)param2,fp);
  writeword((uint)param3,fp);
  uVar2 = parity;
  fputc((uint)parity,(FILE *)fp);
  parity = parity ^ uVar2;
  return;
}

Assistant:

static void writeheader(unsigned char flag, const char *fname, unsigned short param1, unsigned short param2, unsigned short param3, FILE *fp) {
	/* Write out the code header file */
	writeword(19, fp);		/* Header len */
	writebyte(0, fp);		/* Header is 0 */
	parity = 0;
	writebyte(flag, fp);	/* Filetype flag */

	const char *ptr = fname;
	for (int i = 0; i < 10; i++) {
		if (*ptr) {
			writebyte(*ptr++, fp);
		} else {
			writebyte(' ', fp);
		}
	}

	writeword(param1, fp);
	writeword(param2, fp);
	writeword(param3, fp);
	writebyte(parity, fp);
}